

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_unsignedInt(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_7c0;
  StrX local_7b0;
  char *local_7a0;
  char *actRetCanRep_inchar_5;
  wchar16 *local_788;
  XMLCh *actRetCanRep_9;
  undefined1 local_778 [4];
  Status myStatus_23;
  StrX local_768;
  char *local_758;
  char *actRetCanRep_inchar_4;
  wchar16 *local_740;
  XMLCh *actRetCanRep_8;
  undefined1 local_730 [4];
  Status myStatus_22;
  StrX local_720;
  StrX local_710;
  long local_700;
  XMLCh *actRetCanRep_7;
  undefined1 local_6f0 [4];
  Status myStatus_21;
  StrX local_6e0;
  StrX local_6d0;
  long local_6c0;
  XMLCh *actRetCanRep_6;
  undefined1 local_6b0 [4];
  Status myStatus_20;
  StrX local_6a0;
  StrX local_690;
  long local_680;
  XMLCh *actRetCanRep_5;
  undefined1 local_670 [4];
  Status myStatus_19;
  StrX local_660;
  StrX local_650;
  long local_640;
  XMLCh *actRetCanRep_4;
  undefined1 local_630 [4];
  Status myStatus_18;
  StrX local_620;
  char *local_610;
  char *actRetCanRep_inchar_3;
  wchar16 *local_5f8;
  XMLCh *actRetCanRep_3;
  undefined1 local_5e8 [4];
  Status myStatus_17;
  StrX local_5d8;
  char *local_5c8;
  char *actRetCanRep_inchar_2;
  wchar16 *local_5b0;
  XMLCh *actRetCanRep_2;
  undefined1 local_5a0 [4];
  Status myStatus_16;
  StrX local_590;
  char *local_580;
  char *actRetCanRep_inchar_1;
  wchar16 *local_568;
  XMLCh *actRetCanRep_1;
  undefined1 local_558 [4];
  Status myStatus_15;
  StrX local_548;
  char *local_538;
  char *actRetCanRep_inchar;
  wchar16 *local_520;
  XMLCh *actRetCanRep;
  Status myStatus_14;
  int j;
  StrX local_500;
  StrX local_4f0;
  XSValue *local_4e0;
  XSValue *actRetValue_6;
  undefined1 local_4d0 [4];
  Status myStatus_13;
  StrX local_4c0;
  StrX local_4b0;
  XSValue *local_4a0;
  XSValue *actRetValue_5;
  undefined1 local_490 [4];
  Status myStatus_12;
  StrX local_480;
  StrX local_470;
  XSValue *local_460;
  XSValue *actRetValue_4;
  undefined1 local_450 [4];
  Status myStatus_11;
  StrX local_440;
  StrX local_430;
  XSValue *local_420;
  XSValue *actRetValue_3;
  undefined1 local_410 [4];
  Status myStatus_10;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  StrX local_3b0;
  XSValue *local_3a0;
  XSValue *actRetValue_2;
  undefined1 local_390 [4];
  Status myStatus_9;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  StrX local_330;
  XSValue *local_320;
  XSValue *actRetValue_1;
  undefined1 local_310 [4];
  Status myStatus_8;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  StrX local_2b0;
  XSValue *local_2a0;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_280;
  StrX local_270;
  byte local_25d;
  Status local_25c;
  undefined1 local_258 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_248;
  StrX local_238;
  byte local_225;
  Status local_224;
  undefined1 local_220 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_210;
  StrX local_200;
  byte local_1ed;
  Status local_1ec;
  undefined1 local_1e8 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_1d8;
  StrX local_1c8;
  byte local_1b5;
  Status local_1b4;
  undefined1 local_1b0 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_1a0;
  byte local_18d;
  Status local_18c;
  undefined1 local_188 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_178;
  byte local_165;
  Status local_164;
  undefined1 local_160 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_140;
  byte local_12d;
  Status local_12c;
  char acStack_128 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [6];
  char data_rawstr_2 [9];
  char data_canrep_1 [6];
  char data_rawstr_1 [14];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char lex_v_ran_iv_2_canrep [3];
  char lex_v_ran_iv_1_canrep [11];
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_v_1_canrep [11];
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char acStack_40 [4];
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_iv_1 [11];
  char lex_v_ran_v_2 [2];
  char lex_v_ran_v_1 [12];
  char lex_v_ran_v_0 [12];
  bool toValidate;
  DataType dt;
  
  stack0xffffffffffffffe0 = 0x2034333231202020;
  stack0xffffffffffffffd0 = 0x373639343932342b;
  lex_v_ran_v_1[0] = '2';
  lex_v_ran_v_1[1] = '9';
  lex_v_ran_v_1[2] = '5';
  lex_v_ran_v_1[3] = '\0';
  lex_v_ran_iv_1[6] = '0';
  lex_v_ran_iv_1[7] = '\0';
  _acStack_40 = 0x37363934393234;
  act_v_ran_v_0.fValue._30_1_ = 0;
  act_v_ran_v_0.fValue._28_2_ = 0x312d;
  act_v_ran_v_0.f_datatype = 0x4d2;
  act_v_ran_v_1.f_datatype = ~dt_string;
  act_v_ran_v_2.f_datatype = dt_string;
  stack0xffffffffffffff30 = 0x37363934393234;
  lex_v_ran_iv_1_canrep[6] = '0';
  lex_v_ran_iv_1_canrep[7] = '\0';
  stack0xffffffffffffff20 = 0x37363934393234;
  lex_iv_1[6] = '\0';
  lex_iv_1[4] = '-';
  lex_iv_1[5] = '1';
  builtin_strncpy(lex_iv_2,"12b34.45",8);
  lex_iv_1[0] = '6';
  lex_iv_1[1] = '\0';
  stack0xffffffffffffff08 = 0x36356234333231;
  data_rawstr_1[0] = '5';
  data_rawstr_1[1] = ' ';
  data_rawstr_1[2] = ' ';
  data_rawstr_1[3] = ' ';
  data_rawstr_1[4] = '\n';
  data_rawstr_1[5] = '\0';
  builtin_strncpy(data_canrep_1,"   +12",6);
  stack0xfffffffffffffef0 = 0x34333231;
  _data_canrep_2 = 0x3534333231303030;
  data_rawstr_2[0] = '\0';
  myStatus._0_2_ = 0x35;
  _acStack_128 = 0x34333231;
  local_12c = st_Init;
  StrX::StrX(&local_140,lex_v_ran_v_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_140);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedInt,&local_12c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_140);
  local_12d = bVar1 & 1;
  if (local_12d != 1) {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX((StrX *)local_160,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_160);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa73,lex_v_ran_v_1 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_160);
    errSeen = true;
  }
  local_164 = st_Init;
  StrX::StrX(&local_178,lex_v_ran_iv_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_178);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedInt,&local_164,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_178);
  local_165 = bVar1 & 1;
  if (local_165 != 1) {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX((StrX *)local_188,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_188);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa74,lex_v_ran_iv_1 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_188);
    errSeen = true;
  }
  local_18c = st_Init;
  StrX::StrX(&local_1a0,lex_v_ran_iv_1 + 6);
  pXVar3 = StrX::unicodeForm(&local_1a0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedInt,&local_18c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1a0);
  local_18d = bVar1 & 1;
  if (local_18d != 1) {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX((StrX *)local_1b0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_1b0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa75,lex_v_ran_iv_1 + 6,pcVar4,1);
    StrX::~StrX((StrX *)local_1b0);
    errSeen = true;
  }
  local_1b4 = st_Init;
  StrX::StrX(&local_1c8,acStack_40);
  pXVar3 = StrX::unicodeForm(&local_1c8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedInt,&local_1b4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1c8);
  local_1b5 = bVar1 & 1;
  if (local_1b5 == 0) {
    if (local_1b4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_1e8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1e8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1b4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa78,acStack_40,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1e8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX(&local_1d8,pXVar3);
    pcVar4 = StrX::localForm(&local_1d8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa78,acStack_40,pcVar4,0);
    StrX::~StrX(&local_1d8);
    errSeen = true;
  }
  local_1ec = st_Init;
  StrX::StrX(&local_200,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm(&local_200);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedInt,&local_1ec,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_200);
  local_1ed = bVar1 & 1;
  if (local_1ed == 0) {
    if (local_1ec != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_220,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_220);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1ec);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa79,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_220);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX(&local_210,pXVar3);
    pcVar4 = StrX::localForm(&local_210);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa79,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,0);
    StrX::~StrX(&local_210);
    errSeen = true;
  }
  local_224 = st_Init;
  StrX::StrX(&local_238,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_238);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedInt,&local_224,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_238);
  local_225 = bVar1 & 1;
  if (local_225 == 0) {
    if (local_224 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_258,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_258);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_224);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa7c,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_258);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX(&local_248,pXVar3);
    pcVar4 = StrX::localForm(&local_248);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa7c,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_248);
    errSeen = true;
  }
  local_25c = st_Init;
  StrX::StrX(&local_270,data_rawstr_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_270);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedInt,&local_25c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_270);
  local_25d = bVar1 & 1;
  if (local_25d == 0) {
    if (local_25c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_25c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa7d,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX(&local_280,pXVar3);
    pcVar4 = StrX::localForm(&local_280);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa7d,data_rawstr_1 + 8,pcVar4,0);
    StrX::~StrX(&local_280);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_2b0,lex_v_ran_v_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_2b0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedInt,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2b0);
    local_2a0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_310,pXVar3);
      StrX::localForm((StrX *)local_310);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9a,lex_v_ran_v_1 + 8);
      StrX::~StrX((StrX *)local_310);
      errSeen = true;
    }
    else {
      memcpy(&local_2d8,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_300,pvVar10,0x28);
      actValue.fValue.f_long = uStack_2d0;
      actValue._0_8_ = local_2d8;
      actValue.fValue._8_8_ = local_2c8;
      actValue.fValue._16_8_ = uStack_2c0;
      actValue.fValue.f_datetime.f_milisec = (double)local_2b8;
      expValue.fValue.f_long = uStack_2f8;
      expValue._0_8_ = local_300;
      expValue.fValue._8_8_ = local_2f0;
      expValue.fValue._16_8_ = uStack_2e8;
      expValue.fValue.f_datetime.f_milisec = (double)local_2e0;
      bVar2 = compareActualValue(dt_unsignedInt,actValue,expValue);
      pXVar5 = local_2a0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_2a0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2a0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_330,lex_v_ran_iv_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_330);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_330);
    local_320 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_390,pXVar3);
      StrX::localForm((StrX *)local_390);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9c,lex_v_ran_iv_1 + 8);
      StrX::~StrX((StrX *)local_390);
      errSeen = true;
    }
    else {
      memcpy(&local_358,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_380,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_350;
      actValue_00._0_8_ = local_358;
      actValue_00.fValue._8_8_ = local_348;
      actValue_00.fValue._16_8_ = uStack_340;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_338;
      expValue_00.fValue.f_long = uStack_378;
      expValue_00._0_8_ = local_380;
      expValue_00.fValue._8_8_ = local_370;
      expValue_00.fValue._16_8_ = uStack_368;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_360;
      bVar2 = compareActualValue(dt_unsignedInt,actValue_00,expValue_00);
      pXVar5 = local_320;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_320 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_320);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_3b0,lex_v_ran_iv_1 + 6);
    pXVar3 = StrX::unicodeForm(&local_3b0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3b0);
    local_3a0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_410,pXVar3);
      StrX::localForm((StrX *)local_410);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9d,lex_v_ran_iv_1 + 6);
      StrX::~StrX((StrX *)local_410);
      errSeen = true;
    }
    else {
      memcpy(&local_3d8,pXVar5,0x28);
      pcVar4 = lex_v_ran_v_1_canrep + 8;
      memcpy(&local_400,pcVar4,0x28);
      actValue_01.fValue.f_long = uStack_3d0;
      actValue_01._0_8_ = local_3d8;
      actValue_01.fValue._8_8_ = local_3c8;
      actValue_01.fValue._16_8_ = uStack_3c0;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_3b8;
      expValue_01.fValue.f_long = uStack_3f8;
      expValue_01._0_8_ = local_400;
      expValue_01.fValue._8_8_ = local_3f0;
      expValue_01.fValue._16_8_ = uStack_3e8;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_3e0;
      bVar2 = compareActualValue(dt_unsignedInt,actValue_01,expValue_01);
      pXVar5 = local_3a0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_3a0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3a0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_430,acStack_40);
    pXVar3 = StrX::unicodeForm(&local_430);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_430);
    local_420 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX((StrX *)local_450,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_450);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xa9e,acStack_40,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_450);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_440,pXVar3);
      StrX::localForm(&local_440);
      pvVar10 = (void *)0xa9e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9e,acStack_40);
      StrX::~StrX(&local_440);
      pXVar5 = local_420;
      errSeen = true;
      if (local_420 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_420);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_470,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
    pXVar3 = StrX::unicodeForm(&local_470);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    local_460 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX((StrX *)local_490,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_490);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xa9f,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_490);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_480,pXVar3);
      StrX::localForm(&local_480);
      pvVar10 = (void *)0xa9f;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9f,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c));
      StrX::~StrX(&local_480);
      pXVar5 = local_460;
      errSeen = true;
      if (local_460 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_460);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_4b0,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_4b0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4b0);
    local_4a0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX((StrX *)local_4d0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_4d0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xaa1,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_4d0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_4c0,pXVar3);
      StrX::localForm(&local_4c0);
      pvVar10 = (void *)0xaa1;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xaa1,lex_iv_2);
      StrX::~StrX(&local_4c0);
      pXVar5 = local_4a0;
      errSeen = true;
      if (local_4a0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4a0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_4f0,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_4f0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4f0);
    local_4e0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX((StrX *)&myStatus_14,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_14);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xaa2,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_14);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_500,pXVar3);
      StrX::localForm(&local_500);
      pvVar10 = (void *)0xaa2;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xaa2,data_rawstr_1 + 8);
      StrX::~StrX(&local_500);
      pXVar5 = local_4e0;
      errSeen = true;
      if (local_4e0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4e0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedInt,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_520 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_558,pXVar3);
      StrX::localForm((StrX *)local_558);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac0,data_canrep_1);
      StrX::~StrX((StrX *)local_558);
      errSeen = true;
    }
    else {
      local_538 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_538,data_rawstr_2 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX(&local_548,pXVar3);
        pcVar4 = StrX::localForm(&local_548);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac0,data_canrep_1,pcVar4,local_538,data_rawstr_2 + 8);
        StrX::~StrX(&local_548);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_520);
      xercesc_4_0::XMLString::release(&local_538,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_568 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_5a0,pXVar3);
      StrX::localForm((StrX *)local_5a0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac1,data_canrep_2);
      StrX::~StrX((StrX *)local_5a0);
      errSeen = true;
    }
    else {
      local_580 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_580,acStack_128);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX(&local_590,pXVar3);
        pcVar4 = StrX::localForm(&local_590);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac1,data_canrep_2,pcVar4,local_580,acStack_128);
        StrX::~StrX(&local_590);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_568);
      xercesc_4_0::XMLString::release(&local_580,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,lex_v_ran_iv_1 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_5b0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_5e8,pXVar3);
      StrX::localForm((StrX *)local_5e8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac3,lex_v_ran_iv_1 + 8);
      StrX::~StrX((StrX *)local_5e8);
      errSeen = true;
    }
    else {
      local_5c8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5c8,lex_v_ran_iv_1_canrep + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX(&local_5d8,pXVar3);
        pcVar4 = StrX::localForm(&local_5d8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac3,lex_v_ran_iv_1 + 8,pcVar4,local_5c8,lex_v_ran_iv_1_canrep + 8);
        StrX::~StrX(&local_5d8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5b0);
      xercesc_4_0::XMLString::release(&local_5c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,lex_v_ran_iv_1 + 6);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_5f8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_630,pXVar3);
      StrX::localForm((StrX *)local_630);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac4,lex_v_ran_iv_1 + 6);
      StrX::~StrX((StrX *)local_630);
      errSeen = true;
    }
    else {
      local_610 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_610,lex_v_ran_iv_1_canrep + 6);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX(&local_620,pXVar3);
        pcVar4 = StrX::localForm(&local_620);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac4,lex_v_ran_iv_1 + 6,pcVar4,local_610,lex_v_ran_iv_1_canrep + 6);
        StrX::~StrX(&local_620);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5f8);
      xercesc_4_0::XMLString::release(&local_610,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_650,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_650);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_650);
    local_640 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX((StrX *)local_670,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_670);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xac6,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_670);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_660,pXVar3);
      StrX::localForm(&local_660);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac6,lex_iv_2);
      StrX::~StrX(&local_660);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_640);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_690,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_690);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_690);
    local_680 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedInt);
        StrX::StrX((StrX *)local_6b0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_6b0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xac7,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_6b0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_6a0,pXVar3);
      StrX::localForm(&local_6a0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac7,data_rawstr_1 + 8);
      StrX::~StrX(&local_6a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_680);
      errSeen = true;
    }
  }
  actRetCanRep_6._4_4_ = st_Init;
  StrX::StrX(&local_6d0,acStack_40);
  pXVar3 = StrX::unicodeForm(&local_6d0);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_6 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_6d0);
  local_6c0 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_6._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_6f0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_6f0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_6._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xacc,acStack_40,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_6f0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX(&local_6e0,pXVar3);
    StrX::localForm(&local_6e0);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xacc,acStack_40);
    StrX::~StrX(&local_6e0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6c0);
    errSeen = true;
  }
  actRetCanRep_7._4_4_ = st_Init;
  StrX::StrX(&local_710,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm(&local_710);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_7 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_710);
  local_700 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_7._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX((StrX *)local_730,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_730);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_7._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xacd,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_730);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX(&local_720,pXVar3);
    pcVar4 = StrX::localForm(&local_720);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xacd,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4);
    StrX::~StrX(&local_720);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_700);
    errSeen = true;
  }
  actRetCanRep_8._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_4,acStack_40);
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_8 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
  local_740 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX((StrX *)local_778,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_778);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xad0,acStack_40,pcVar4);
    StrX::~StrX((StrX *)local_778);
    errSeen = true;
  }
  else {
    local_758 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_758,lex_iv_1 + 8);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_768,pXVar3);
      pcVar4 = StrX::localForm(&local_768);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xad0,acStack_40,pcVar4,local_758,lex_iv_1 + 8);
      StrX::~StrX(&local_768);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_740);
    xercesc_4_0::XMLString::release(&local_758,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  actRetCanRep_9._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_5,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_unsignedInt,(Status *)((long)&actRetCanRep_9 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
  local_788 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_unsignedInt);
    StrX::StrX(&local_7c0,pXVar3);
    pcVar4 = StrX::localForm(&local_7c0);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xad1,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4);
    StrX::~StrX(&local_7c0);
    errSeen = true;
  }
  else {
    local_7a0 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_7a0,lex_iv_1 + 4);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_unsignedInt);
      StrX::StrX(&local_7b0,pXVar3);
      pcVar4 = StrX::localForm(&local_7b0);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xad1,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,local_7a0,lex_iv_1 + 4
            );
      StrX::~StrX(&local_7b0);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_788);
    xercesc_4_0::XMLString::release(&local_7a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
}

Assistant:

void test_dt_unsignedInt()
{
    const XSValue::DataType dt = XSValue::dt_unsignedInt;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   1234   \n";

    const char lex_v_ran_v_1[]="+4294967295";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="4294967296";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_uint = (unsigned int)1234;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_uint = (unsigned int)+4294967295;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_uint = (unsigned int)0;

    const char lex_v_ran_v_1_canrep[]="4294967295";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="4294967296";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.22.2 Canonical representation
 *
 * The canonical representation for unsignedInt is defined by prohibiting certain options from the
 * Lexical representation (3.3.22.1). Specifically,
 * leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}